

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O0

void __thiscall ut_raw::node_op_equal_root::test_method(node_op_equal_root *this)

{
  undefined8 uVar1;
  bool bVar2;
  node_type *pnVar3;
  node_type *this_00;
  lazy_ostream *plVar4;
  const_bf_iterator *pcVar5;
  pointer pnVar6;
  data_type *pdVar7;
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  *pnVar8;
  size_type sVar9;
  basic_cstring<const_char> local_1b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1b40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
  local_1b20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
  local_1b00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_1ae0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_1ac0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1aa0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a60;
  assertion_result local_1a40;
  basic_cstring<const_char> local_1a28;
  basic_cstring<const_char> local_1a18;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_1a08;
  const_bf_iterator local_19b0;
  const_bf_iterator local_1958;
  const_bf_iterator local_1900;
  stringstream local_18a8 [8];
  stringstream tst_5;
  ostream local_1898 [376];
  basic_cstring<const_char> local_1720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1710;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_16f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_16d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_16b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_1690;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_1670;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1650;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1610;
  assertion_result local_15f0;
  basic_cstring<const_char> local_15d8;
  basic_cstring<const_char> local_15c8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_15b8;
  const_bf_iterator local_1560;
  const_bf_iterator local_1508;
  const_bf_iterator local_14b0;
  stringstream local_1458 [8];
  stringstream tst_4;
  ostream local_1448 [376];
  basic_cstring<const_char> local_12d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_12a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_1280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_1260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>
  local_1240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_1220;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1200;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_11e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c0;
  assertion_result local_11a0;
  basic_cstring<const_char> local_1188;
  basic_cstring<const_char> local_1178;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_1168;
  const_bf_iterator local_1110;
  const_bf_iterator local_10b8;
  const_bf_iterator local_1060;
  stringstream local_1008 [8];
  stringstream tst_3;
  ostream local_ff8 [376];
  basic_cstring<const_char> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_e50;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
  local_e30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
  local_e10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_df0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_dd0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_db0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  assertion_result local_d50;
  basic_cstring<const_char> local_d38;
  basic_cstring<const_char> local_d28;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_d18;
  const_bf_iterator local_cc0;
  const_bf_iterator local_c68;
  const_bf_iterator local_c10;
  stringstream local_bb8 [8];
  stringstream tst_2;
  ostream local_ba8 [376];
  basic_cstring<const_char> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_a00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_9e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_9c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_9a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_980;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_960;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  assertion_result local_900;
  basic_cstring<const_char> local_8e8;
  basic_cstring<const_char> local_8d8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_8c8;
  const_bf_iterator local_870;
  const_bf_iterator local_818;
  const_bf_iterator local_7c0;
  stringstream local_768 [8];
  stringstream tst_1;
  ostream local_758 [376];
  basic_cstring<const_char> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_5b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_590;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_570;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>
  local_550;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_530;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_510;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  assertion_result local_4b0;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_478;
  const_bf_iterator local_420;
  const_bf_iterator local_3c8;
  const_bf_iterator local_370;
  stringstream local_318 [8];
  stringstream tst;
  ostream local_308 [380];
  undefined4 local_18c;
  size_type local_188;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  undefined4 local_124;
  size_type local_120;
  basic_cstring<const_char> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_108;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  data_type local_bc;
  iterator local_b8;
  data_type local_9c;
  iterator local_98;
  data_type local_7c;
  undefined1 local_78 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t2;
  iterator local_58;
  data_type local_2c;
  undefined1 local_28 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t1;
  node_op_equal_root *this_local;
  
  t1._16_8_ = this;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  local_2c = 2;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28,
             &local_2c);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  t2._20_4_ = 3;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_58,pnVar3,(data_type *)&t2.field_0x14);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_58);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  local_7c = 5;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78,
             &local_7c);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  local_9c = 7;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_98,pnVar3,&local_9c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_98);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  local_bc = 0xb;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_b8,pnVar3,&local_bc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_b8);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  this_00 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28);
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::
  operator=(this_00,pnVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d0,0x1e8,&local_e0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_108,plVar4,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_120 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::size
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_124 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_108,&local_118,0x1e8,1,2,&local_120,"t1.size()",&local_124,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x1e9,&local_148);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_170,plVar4,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_188 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::depth
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_18c = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_170,&local_180,0x1e9,1,2,&local_188,"t1.depth()",&local_18c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::stringstream(local_318);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_370,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar5,&local_370);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_370);
  while( true ) {
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3c8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_3c8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3c8);
    if (!bVar2) break;
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_420,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_420);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_420);
    if (bVar2) {
      std::operator<<(local_308," ");
    }
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar6 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar5);
    pdVar7 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar6);
    std::ostream::operator<<(local_308,*pdVar7);
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_478,pcVar5);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_478);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_498);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_488,0x1eb,&local_498);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_4d0,"5 7 11");
    boost::test_tools::assertion_result::assertion_result(&local_4b0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5b0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_590,&local_5b0,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_570,&local_590,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_550,&local_570,(char (*) [7])0x405cb7);
    boost::unit_test::operator<<(&local_530,&local_550,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_510,&local_530,&local_5d0);
    boost::unit_test::operator<<(&local_4f0,&local_510,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_4b0,&local_4f0,&local_5e0,0x1eb,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_4f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_510);
    std::__cxx11::string::~string((string *)&local_5d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_530);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_550);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_570);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_590);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_5b0);
    boost::test_tools::assertion_result::~assertion_result(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_318);
  std::__cxx11::stringstream::stringstream(local_768);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_7c0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar5,&local_7c0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_7c0);
  while( true ) {
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_818,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_818);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_818);
    if (!bVar2) break;
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_870,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_870);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_870);
    if (bVar2) {
      std::operator<<(local_758," ");
    }
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar5)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::ply(pnVar8);
    std::ostream::operator<<(local_758,sVar9);
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_8c8,pcVar5);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_8c8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8d8,0x1ec,&local_8e8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_920,"0 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_900,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a00,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_9e0,&local_a00,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_9c0,&local_9e0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_9a0,&local_9c0,(char (*) [6])"0 1 1");
    boost::unit_test::operator<<(&local_980,&local_9a0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_960,&local_980,&local_a20);
    boost::unit_test::operator<<(&local_940,&local_960,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a30,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_900,&local_940,&local_a30,0x1ec,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_940);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_960);
    std::__cxx11::string::~string((string *)&local_a20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_980);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_9a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_9c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_9e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_a00);
    boost::test_tools::assertion_result::~assertion_result(&local_900);
    std::__cxx11::string::~string((string *)&local_920);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_768);
  std::__cxx11::stringstream::stringstream(local_bb8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_c10,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar5,&local_c10);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_c10);
  while( true ) {
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_c68,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_c68);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_c68);
    if (!bVar2) break;
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_cc0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_cc0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_cc0);
    if (bVar2) {
      std::operator<<(local_ba8," ");
    }
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar5)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::subtree_size(pnVar8);
    std::ostream::operator<<(local_ba8,sVar9);
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_d18,pcVar5);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_d18);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d28,0x1ed,&local_d38);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_d70,"3 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_d50,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e50,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_e30,&local_e50,(char (*) [15])"subtree_size()");
    boost::unit_test::operator<<(&local_e10,&local_e30,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_df0,&local_e10,(char (*) [6])0x405dc0);
    boost::unit_test::operator<<(&local_dd0,&local_df0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_db0,&local_dd0,&local_e70);
    boost::unit_test::operator<<(&local_d90,&local_db0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e80,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_d50,&local_d90,&local_e80,0x1ed,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_d90);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_db0);
    std::__cxx11::string::~string((string *)&local_e70);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_dd0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_df0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_e10);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
    ::~lazy_ostream_impl(&local_e30);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_e50);
    boost::test_tools::assertion_result::~assertion_result(&local_d50);
    std::__cxx11::string::~string((string *)&local_d70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_bb8);
  std::__cxx11::stringstream::stringstream(local_1008);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_1060,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar5,&local_1060);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_1060);
  while( true ) {
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_10b8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_10b8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_10b8);
    if (!bVar2) break;
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1110,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_1110);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1110);
    if (bVar2) {
      std::operator<<(local_ff8," ");
    }
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    pnVar6 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar5);
    pdVar7 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar6);
    std::ostream::operator<<(local_ff8,*pdVar7);
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_1168,pcVar5);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1168);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1178,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1178,0x1ef,&local_1188);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_11c0,"5 7 11");
    boost::test_tools::assertion_result::assertion_result(&local_11a0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_12a0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1280,&local_12a0,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_1260,&local_1280,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1240,&local_1260,(char (*) [7])0x405cb7);
    boost::unit_test::operator<<(&local_1220,&local_1240,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1200,&local_1220,&local_12c0);
    boost::unit_test::operator<<(&local_11e0,&local_1200,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_11a0,&local_11e0,&local_12d0,0x1ef,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_11e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1200);
    std::__cxx11::string::~string((string *)&local_12c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1220);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_1240);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1260);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_1280);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_12a0);
    boost::test_tools::assertion_result::~assertion_result(&local_11a0);
    std::__cxx11::string::~string((string *)&local_11c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1008);
  std::__cxx11::stringstream::stringstream(local_1458);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_14b0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar5,&local_14b0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_14b0);
  while( true ) {
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1508,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_1508);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1508);
    if (!bVar2) break;
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1560,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_1560);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1560);
    if (bVar2) {
      std::operator<<(local_1448," ");
    }
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar5)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::ply(pnVar8);
    std::ostream::operator<<(local_1448,sVar9);
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_15b8,pcVar5);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_15b8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15c8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_15d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_15c8,0x1f0,&local_15d8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1610,"0 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_15f0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_16f0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_16d0,&local_16f0,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_16b0,&local_16d0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1690,&local_16b0,(char (*) [6])"0 1 1");
    boost::unit_test::operator<<(&local_1670,&local_1690,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1650,&local_1670,&local_1710);
    boost::unit_test::operator<<(&local_1630,&local_1650,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1720,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_15f0,&local_1630,&local_1720,0x1f0,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1630);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1650);
    std::__cxx11::string::~string((string *)&local_1710);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1670);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1690);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_16b0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_16d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_16f0);
    boost::test_tools::assertion_result::~assertion_result(&local_15f0);
    std::__cxx11::string::~string((string *)&local_1610);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1458);
  std::__cxx11::stringstream::stringstream(local_18a8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_1900,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar5,&local_1900);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_1900);
  while( true ) {
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1958,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_1958);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1958);
    if (!bVar2) break;
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_19b0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar5,&local_19b0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_19b0);
    if (bVar2) {
      std::operator<<(local_1898," ");
    }
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar5)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::subtree_size(pnVar8);
    std::ostream::operator<<(local_1898,sVar9);
    pcVar5 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_1a08,pcVar5);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1a08);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a18,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a28);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a18,0x1f1,&local_1a28);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1a60,"3 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_1a40,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1b40,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1b20,&local_1b40,(char (*) [15])"subtree_size()");
    boost::unit_test::operator<<(&local_1b00,&local_1b20,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1ae0,&local_1b00,(char (*) [6])0x405dc0);
    boost::unit_test::operator<<(&local_1ac0,&local_1ae0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1aa0,&local_1ac0,&local_1b60);
    boost::unit_test::operator<<(&local_1a80,&local_1aa0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b70,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1a40,&local_1a80,&local_1b70,0x1f1,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1a80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1aa0);
    std::__cxx11::string::~string((string *)&local_1b60);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1ac0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1ae0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1b00);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
    ::~lazy_ostream_impl(&local_1b20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1b40);
    boost::test_tools::assertion_result::~assertion_result(&local_1a40);
    std::__cxx11::string::~string((string *)&local_1a60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_18a8);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_78);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(node_op_equal_root) {
    tree<int> t1;
    t1.insert(2);
    t1.root().insert(3);

    tree<int> t2;
    t2.insert(5);
    t2.root().insert(7);
    t2.root().insert(11);

    t1.root() = t2.root();
    BOOST_CHECK_EQUAL(t1.size(), 3);
    BOOST_CHECK_EQUAL(t1.depth(), 2);

    CHECK_TREE(t1, data(), "5 7 11");
    CHECK_TREE(t1, ply(), "0 1 1");
    CHECK_TREE(t1, subtree_size(), "3 1 1");

    CHECK_TREE(t2, data(), "5 7 11");
    CHECK_TREE(t2, ply(), "0 1 1");
    CHECK_TREE(t1, subtree_size(), "3 1 1");
}